

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O3

bool pvmath::houghTransform<float>(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  size_type __n;
  uint uVar11;
  pointer pPVar12;
  float __x;
  float fVar13;
  float fVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 in_register_00001344 [12];
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOnLine;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> point;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOffLine;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> local_b8;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> local_a0;
  undefined1 local_88 [16];
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> local_78;
  double local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar6 = Test_Helper::runCount();
  if (uVar6 != 0) {
    uVar11 = 0;
    do {
      iVar7 = rand();
      dVar15 = toRadians((double)(iVar7 + -0xb4 + (iVar7 / 0x168) * -0x168));
      __x = (float)dVar15;
      iVar7 = rand();
      auVar16._0_4_ = (float)(iVar7 % 100);
      auVar16._4_12_ = in_register_00001344;
      auVar16 = vfmadd213ss_fma(auVar16,SUB6416(ZEXT464(0x3dcccccd),0),ZEXT416(0));
      local_60 = toRadians((double)(auVar16._0_4_ + 0.1));
      uVar8 = rand();
      iVar7 = rand();
      auVar17._0_4_ = (float)(iVar7 % 0x1ea);
      auVar17._4_12_ = in_register_00001344;
      auVar16 = vfmadd132ss_fma(auVar17,SUB6416(ZEXT464(0x3dcccccd),0),ZEXT416(0x3c23d70a));
      local_58 = ZEXT416((uint)(auVar16._0_4_ * 0.5));
      uVar9 = rand();
      __n = (size_type)(uVar9 % 100);
      if (uVar9 % 100 < 0x33) {
        __n = 0x32;
      }
      std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::vector
                (&local_a0,__n,(allocator_type *)&local_b8);
      fVar13 = sinf(__x);
      fVar14 = cosf(__x);
      if (local_a0.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_a0.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        fVar20 = local_58._0_4_;
        local_48._0_4_ = fVar20 / 10.0;
        local_48._4_12_ = local_58._4_12_;
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        local_88 = vxorps_avx512vl(local_58,auVar4);
        uVar1 = vcmpps_avx512vl(local_58,ZEXT816(0) << 0x20,1);
        uVar2 = vcmpps_avx512vl(local_48,ZEXT816(0) << 0x20,1);
        iVar7 = (int)((fVar20 + fVar20) / (float)local_48._0_4_);
        pPVar12 = local_a0.
                  super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (iVar7 < 2) {
          iVar7 = 1;
        }
        do {
          iVar10 = rand();
          auVar21._0_4_ = (float)(iVar10 % 200000);
          auVar21._4_12_ = in_register_00001344;
          auVar17 = vfmadd132ss_fma(auVar21,SUB6416(ZEXT464(0xc47a0000),0),ZEXT416(0x3c23d70a));
          if ((((ushort)uVar1 | (ushort)uVar2) & 1) == 0) {
            iVar10 = rand();
            auVar18._0_4_ = (float)(iVar10 % iVar7);
            auVar18._4_12_ = in_register_00001344;
            auVar4 = vfmadd132ss_fma(auVar18,local_88,ZEXT416((uint)local_48._0_4_));
            fVar20 = auVar4._0_4_ + auVar17._0_4_;
            iVar10 = rand();
            auVar19._0_4_ = (float)(iVar10 % iVar7);
            auVar19._4_12_ = in_register_00001344;
            auVar17 = vfmadd132ss_fma(auVar19,local_88,ZEXT416((uint)local_48._0_4_));
            fVar3 = auVar17._0_4_;
          }
          else {
            fVar20 = auVar17._0_4_ - (float)local_58._0_4_;
            fVar3 = (float)local_88._0_4_;
          }
          auVar4 = vfmsub231ss_fma(ZEXT416((uint)(fVar13 * fVar3)),ZEXT416((uint)fVar20),
                                   ZEXT416((uint)fVar14));
          auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar3)),ZEXT416((uint)fVar13),
                                    ZEXT416((uint)fVar20));
          pPVar12->x = auVar4._0_4_;
          pPVar12->y = auVar17._0_4_;
          pPVar12 = pPVar12 + 1;
        } while (pPVar12 !=
                 local_a0.
                 super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar5 = Image_Function::HoughTransform
                        (&local_a0,__x,(float)local_60,
                         (float)local_60 / (float)(uVar8 % 0x32 + (uint)(uVar8 % 0x32 == 0)),
                         auVar16._0_4_,&local_b8,&local_78);
      if (!bVar5 || local_78.
                    super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_78.
                    super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        if (local_78.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a0.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.
                          super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return false;
      }
      if (local_78.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar11 = uVar11 + 1;
      uVar6 = Test_Helper::runCount();
    } while (uVar11 < uVar6);
  }
  return true;
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }